

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int * get_stem_contributions_d0
                (vrna_fold_compound_t *fc,int j,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f5 *sc_wrapper)

{
  vrna_param_t *p;
  int *piVar1;
  int *piVar2;
  code *pcVar3;
  code *pcVar4;
  uchar uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int *piVar9;
  char *local_b0;
  uint local_a4;
  char *local_a0;
  undefined1 *sc_red_stem;
  undefined1 *sc_spl_stem;
  vrna_md_t *md;
  vrna_param_t *P;
  int *stems;
  int *c;
  int turn;
  int *indx;
  int local_50;
  int ij;
  int i;
  uint type;
  uint n_seq;
  uint s;
  short **S;
  char *ptype;
  sc_wrapper_f5 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int j_local;
  vrna_fold_compound_t *fc_local;
  
  piVar9 = (int *)vrna_alloc(j << 2);
  p = fc->params;
  piVar1 = fc->jindx;
  piVar2 = (fc->matrices->field_2).field_0.c;
  iVar7 = (p->model_details).min_loop_size;
  indx._4_4_ = ((piVar1[j] + j) - iVar7) + -1;
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    local_a0 = (fc->field_23).field_0.ptype;
  }
  else {
    local_a0 = (char *)0x0;
  }
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    local_a4 = 1;
  }
  else {
    local_a4 = (fc->field_23).field_1.n_seq;
  }
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    local_b0 = (char *)0x0;
  }
  else {
    local_b0 = (fc->field_23).field_0.ptype_pf_compat;
  }
  pcVar3 = (code *)sc_wrapper->decomp_stem;
  pcVar4 = (code *)sc_wrapper->red_stem;
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    iVar6 = j - iVar7;
    while (local_50 = iVar6 + -1, 1 < local_50) {
      piVar9[local_50] = 10000000;
      if ((piVar2[indx._4_4_] != 10000000) &&
         (uVar5 = (*evaluate)(1,j,iVar6 + -2,local_50,'\x12',hc_dat_local), uVar5 != '\0')) {
        piVar9[local_50] = piVar2[indx._4_4_];
        uVar8 = vrna_get_ptype(indx._4_4_,local_a0);
        iVar6 = vrna_E_ext_stem(uVar8,-1,-1,p);
        piVar9[local_50] = iVar6 + piVar9[local_50];
      }
      indx._4_4_ = indx._4_4_ + -1;
      iVar6 = local_50;
    }
  }
  else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    iVar6 = j - iVar7;
    while (local_50 = iVar6 + -1, 1 < local_50) {
      piVar9[local_50] = 10000000;
      if ((piVar2[indx._4_4_] != 10000000) &&
         (uVar5 = (*evaluate)(1,j,iVar6 + -2,local_50,'\x12',hc_dat_local), uVar5 != '\0')) {
        piVar9[local_50] = piVar2[indx._4_4_];
        for (type = 0; type < local_a4; type = type + 1) {
          uVar8 = vrna_get_ptype_md((int)*(short *)(*(long *)(local_b0 + (ulong)type * 8) +
                                                   (long)local_50 * 2),
                                    (int)*(short *)(*(long *)(local_b0 + (ulong)type * 8) +
                                                   (long)j * 2),&p->model_details);
          iVar6 = vrna_E_ext_stem(uVar8,-1,-1,p);
          piVar9[local_50] = iVar6 + piVar9[local_50];
        }
      }
      indx._4_4_ = indx._4_4_ + -1;
      iVar6 = local_50;
    }
  }
  if (pcVar3 != (code *)0x0) {
    local_50 = j - iVar7;
    while (iVar7 = local_50, local_50 = iVar7 + -1, 1 < local_50) {
      if (piVar9[local_50] != 10000000) {
        iVar7 = (*pcVar3)(j,iVar7 + -2,local_50,sc_wrapper);
        piVar9[local_50] = iVar7 + piVar9[local_50];
      }
    }
  }
  piVar9[1] = 10000000;
  iVar7 = piVar1[j] + 1;
  if ((piVar2[iVar7] != 10000000) &&
     (uVar5 = (*evaluate)(1,j,1,j,'\x0e',hc_dat_local), uVar5 != '\0')) {
    piVar9[1] = piVar2[iVar7];
    if (fc->type == VRNA_FC_TYPE_SINGLE) {
      uVar8 = vrna_get_ptype(iVar7,local_a0);
      iVar7 = vrna_E_ext_stem(uVar8,-1,-1,p);
      piVar9[1] = iVar7 + piVar9[1];
    }
    else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
      for (type = 0; type < local_a4; type = type + 1) {
        uVar8 = vrna_get_ptype_md((int)*(short *)(*(long *)(local_b0 + (ulong)type * 8) + 2),
                                  (int)*(short *)(*(long *)(local_b0 + (ulong)type * 8) +
                                                 (long)j * 2),&p->model_details);
        iVar7 = vrna_E_ext_stem(uVar8,-1,-1,p);
        piVar9[1] = iVar7 + piVar9[1];
      }
    }
    if (pcVar4 != (code *)0x0) {
      iVar7 = (*pcVar4)(j,1,j,sc_wrapper);
      piVar9[1] = iVar7 + piVar9[1];
    }
  }
  return piVar9;
}

Assistant:

int *
get_stem_contributions_d0(vrna_fold_compound_t      *fc,
                          int                       j,
                          vrna_callback_hc_evaluate *evaluate,
                          struct default_data       *hc_dat_local,
                          struct sc_wrapper_f5      *sc_wrapper)
{
  char                    *ptype;
  short                   **S;
  unsigned int            s, n_seq, type;
  int                     i, ij, *indx, turn, *c, *stems;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f5_split_in_ext_stem *sc_spl_stem;
  sc_f5_reduce_to_stem    *sc_red_stem;

  stems = (int *)vrna_alloc(sizeof(int) * j);

  P     = fc->params;
  md    = &(P->model_details);
  indx  = fc->jindx;
  c     = fc->matrices->c;
  turn  = md->min_loop_size;
  ij    = indx[j] + j - turn - 1;
  ptype = (fc->type == VRNA_FC_TYPE_SINGLE) ? fc->ptype : NULL;
  n_seq = (fc->type == VRNA_FC_TYPE_SINGLE) ? 1 : fc->n_seq;
  S     = (fc->type == VRNA_FC_TYPE_SINGLE) ? NULL : fc->S;

  sc_spl_stem = sc_wrapper->decomp_stem;
  sc_red_stem = sc_wrapper->red_stem;

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      for (i = j - turn - 1; i > 1; i--, ij--) {
        stems[i] = INF;

        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i, VRNA_DECOMP_EXT_EXT_STEM, hc_dat_local))) {
          stems[i]  = c[ij];
          type      = vrna_get_ptype(ij, ptype);
          stems[i]  += vrna_E_ext_stem(type, -1, -1, P);
        }
      }
      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      for (i = j - turn - 1; i > 1; i--, ij--) {
        stems[i] = INF;
        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i, VRNA_DECOMP_EXT_EXT_STEM, hc_dat_local))) {
          stems[i] = c[ij];

          for (s = 0; s < n_seq; s++) {
            type      = vrna_get_ptype_md(S[s][i], S[s][j], md);
            stems[i]  += vrna_E_ext_stem(type, -1, -1, P);
          }
        }
      }
      break;
  }

  if (sc_spl_stem)
    for (i = j - turn - 1; i > 1; i--)
      if (stems[i] != INF)
        stems[i] += sc_spl_stem(j, i - 1, i, sc_wrapper);

  stems[1]  = INF;
  ij        = indx[j] + 1;

  if ((c[ij] != INF) &&
      (evaluate(1, j, 1, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
    stems[1] = c[ij];

    switch (fc->type) {
      case VRNA_FC_TYPE_SINGLE:
        type      = vrna_get_ptype(ij, ptype);
        stems[1]  += vrna_E_ext_stem(type, -1, -1, P);
        break;

      case VRNA_FC_TYPE_COMPARATIVE:
        for (s = 0; s < n_seq; s++) {
          type      = vrna_get_ptype_md(S[s][1], S[s][j], md);
          stems[1]  += vrna_E_ext_stem(type, -1, -1, P);
        }
        break;
    }

    if (sc_red_stem)
      stems[1] += sc_red_stem(j, 1, j, sc_wrapper);
  }

  return stems;
}